

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O2

bool dxil_spv::emit_buffer_load_instruction(Impl *impl,CallInst *instruction)

{
  ResourceKind RVar1;
  StorageClass SVar2;
  bool bVar3;
  ComponentType element_type;
  byte bVar4;
  Id IVar5;
  RawWidth width;
  TypeID TVar6;
  Op OVar7;
  Id IVar8;
  Op OVar9;
  Id IVar10;
  CallInst *pCVar11;
  Value *pVVar12;
  mapped_type *pmVar13;
  LoggingCallback p_Var14;
  Type *pTVar15;
  Type *pTVar16;
  BufferAccessInfo BVar17;
  Operation *pOVar18;
  void *pvVar19;
  Operation *pOVar20;
  ulong extraout_RAX;
  uint uVar21;
  uint uVar22;
  uint i_2;
  uint32_t access_mask;
  ulong uVar23;
  Type *pTVar24;
  char *__ptr;
  char cVar25;
  uint i_1;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint i;
  Builder *pBVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  RawAccessChain RVar32;
  size_t sStack_10e0;
  Id image_id;
  mapped_type *local_10b8;
  CallInst *local_10b0;
  Builder *local_10a8;
  Type *local_10a0;
  Type *local_1098;
  ulong local_1090;
  ulong local_1088;
  mapped_type *local_1080;
  Id component_ids [4];
  Id local_1060;
  Id local_1050;
  Id local_104c;
  BufferAccessInfo local_1048;
  uint local_103c;
  char buffer [4096];
  
  if (((impl->ags).num_instructions == 1) &&
     (pCVar11 = (CallInst *)LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2),
     pCVar11 == (impl->ags).backdoor_instructions[0])) {
    pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar5 = Converter::Impl::get_id_for_value(impl,pVVar12,0);
    (impl->ags).active_uav_ptr = IVar5;
    (impl->ags).active_uav_op = BufferLoad;
    (impl->ags).active_read_backdoor = (Value *)instruction;
    return true;
  }
  bVar3 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  if (!bVar3) {
    return true;
  }
  local_10a8 = Converter::Impl::builder(impl);
  access_mask = 1;
  pVVar12 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  image_id = Converter::Impl::get_id_for_value(impl,pVVar12,0);
  IVar5 = Converter::Impl::get_type_id(impl,image_id);
  pmVar13 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->handle_to_resource_meta,&image_id);
  buffer._0_8_ = instruction;
  local_1080 = std::__detail::
               _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->llvm_composite_meta,(key_type *)buffer);
  uVar27 = local_1080->access_mask;
  local_10b8 = pmVar13;
  if ((pmVar13->storage != StorageClassUniformConstant) &&
     (uVar22 = (uVar27 & 0xf) >> 1 | uVar27 & 0xf, access_mask = uVar22 >> 2 | uVar22,
     pmVar13->storage == StorageClassPhysicalStorageBuffer)) {
    if ((uVar27 & 0x10) == 0) {
      bVar3 = emit_physical_buffer_load_instruction
                        (impl,instruction,&pmVar13->physical_pointer_meta,access_mask,4);
      return bVar3;
    }
    p_Var14 = get_thread_log_callback();
    if (p_Var14 == (LoggingCallback)0x0) {
      __ptr = "[ERROR]: Cannot use BDA and sparse feedback. >:(\n";
      sStack_10e0 = 0x31;
LAB_00165d87:
      fwrite(__ptr,sStack_10e0,1,_stderr);
      fflush(_stderr);
      return false;
    }
    builtin_strncpy(buffer + 0x10,"nd sparse feedback. >:(\n",0x19);
    uVar30._0_1_ = 's';
    uVar30._1_1_ = 'e';
    uVar30._2_1_ = ' ';
    uVar30._3_1_ = 'B';
    uVar31._0_1_ = 'D';
    uVar31._1_1_ = 'A';
    uVar31._2_1_ = ' ';
    uVar31._3_1_ = 'a';
LAB_0016572e:
    builtin_strncpy(buffer,"Cannot u",8);
    buffer[0xc] = (char)uVar31;
    buffer[0xd] = SUB41(uVar31,1);
    buffer[0xe] = SUB41(uVar31,2);
    buffer[0xf] = SUB41(uVar31,3);
    buffer[8] = (char)uVar30;
    buffer[9] = SUB41(uVar30,1);
    buffer[10] = SUB41(uVar30,2);
    buffer[0xb] = SUB41(uVar30,3);
    pvVar19 = get_thread_log_callback_userdata();
    (*p_Var14)(pvVar19,Error,buffer);
    return false;
  }
  emit_buffer_synchronization_validation(impl,instruction,Load);
  local_10b0 = instruction;
  if (((impl->options).nv_raw_access_chains == true) &&
     ((local_10b8->storage == StorageClassPhysicalStorageBuffer ||
      local_10b8->storage == StorageClassStorageBuffer) && (char)((uVar27 & 0x10) >> 4) == '\0')) {
    pTVar15 = LLVMBC::Value::getType((Value *)instruction);
    uVar27 = 0;
    pTVar15 = LLVMBC::Type::getStructElementType(pTVar15,0);
    pCVar11 = local_10b0;
    uVar26 = 1;
    while (uVar27 != 4) {
      uVar22 = uVar27 & 0x1f;
      uVar27 = uVar27 + 1;
      if ((local_1080->access_mask >> uVar22 & 1) != 0) {
        uVar26 = uVar27;
      }
    }
    RVar32 = emit_raw_access_chain(impl,local_10b8,local_10b0,pTVar15,uVar26);
    pOVar18 = Converter::Impl::allocate(impl,OpLoad,(Value *)pCVar11,RVar32.vector_type_id);
    Operation::add_id(pOVar18,RVar32.ptr_id);
    Operation::add_literal(pOVar18,2);
    Operation::add_literal(pOVar18,RVar32.alignment);
    Converter::Impl::add(impl,pOVar18,false);
    bVar3 = type_is_16bit(pTVar15);
    pCVar11 = local_10b0;
    if (((bVar3) && ((impl->execution_mode_meta).native_16bit_operations == false)) &&
       ((impl->options).min_precision_prefer_native_16bit == true)) {
      TVar6 = LLVMBC::Type::getTypeID(pTVar15);
      bVar3 = TVar6 == HalfTyID;
      IVar5 = Converter::Impl::get_type_id(impl,bVar3 * '\x05' + U16,1,uVar26,false);
      pOVar20 = Converter::Impl::allocate(impl,bVar3 + 0x71 + (uint)bVar3,IVar5);
      Operation::add_id(pOVar20,pOVar18->id);
      Converter::Impl::add(impl,pOVar20,false);
      Converter::Impl::rewrite_value(impl,(Value *)local_10b0,pOVar20->id);
      pCVar11 = local_10b0;
    }
  }
  else {
    local_1090 = CONCAT44(local_1090._4_4_,IVar5);
    pTVar15 = LLVMBC::Value::getType((Value *)instruction);
    pTVar16 = LLVMBC::Type::getStructElementType(pTVar15,0);
    pmVar13 = local_10b8;
    RVar1 = local_10b8->kind;
    IVar5 = local_10b8->index_offset_id;
    local_1098 = pTVar15;
    pTVar15 = LLVMBC::Type::getStructElementType(pTVar15,0);
    BVar17 = build_buffer_access(impl,instruction,0,IVar5,pTVar15,access_mask);
    uVar23 = (ulong)BVar17 >> 0x20;
    local_1048 = BVar17;
    width = get_buffer_access_bits_per_component(impl,pmVar13->storage,pTVar16);
    local_10a0 = pTVar16;
    TVar6 = LLVMBC::Type::getTypeID(pTVar16);
    image_id = get_buffer_alias_handle
                         (impl,pmVar13,image_id,(uint)(TVar6 == DoubleTyID),width,
                          BVar17.raw_vec_size);
    if ((uVar27 & 0x10) != 0) {
      spv::Builder::addCapability(local_10a8,CapabilitySparseResidency);
    }
    pBVar29 = local_10a8;
    if (RVar1 == TypedBuffer) {
      bVar3 = spv::Builder::isStorageImageType(local_10a8,(Id)local_1090);
      element_type = Converter::Impl::get_effective_typed_resource_type(local_10b8->component_type);
      IVar5 = Converter::Impl::get_type_id(impl,element_type,1,4,false);
      pCVar11 = local_10b0;
      if ((uVar27 & 0x10) == 0) {
        OVar9 = OpImageFetch;
        OVar7 = OpImageRead;
      }
      else {
        component_ids[0] = spv::Builder::makeUintType(pBVar29,0x20);
        component_ids[1] = IVar5;
        buffer[0] = '\0';
        buffer[1] = '\0';
        buffer[2] = '\0';
        buffer[3] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        buffer[8] = '\0';
        buffer[9] = '\0';
        buffer[10] = '\0';
        buffer[0xb] = '\0';
        buffer[0xc] = '\0';
        buffer[0xd] = '\0';
        buffer[0xe] = '\0';
        buffer[0xf] = '\0';
        buffer[0x10] = '\0';
        buffer[0x11] = '\0';
        buffer[0x12] = '\0';
        buffer[0x13] = '\0';
        buffer[0x14] = '\0';
        buffer[0x15] = '\0';
        buffer[0x16] = '\0';
        buffer[0x17] = '\0';
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_range_initialize<unsigned_int_const*>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)buffer,
                   component_ids);
        IVar5 = Converter::Impl::get_struct_type(impl,(Vector<spv::Id> *)buffer,0,"SparseTexel");
        std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
        ~_Vector_base((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                      buffer);
        OVar7 = OpImageSparseRead;
        OVar9 = OpImageSparseFetch;
      }
      if (bVar3) {
        OVar9 = OVar7;
      }
      pOVar18 = Converter::Impl::allocate(impl,OVar9,(Value *)pCVar11,IVar5);
      if ((uVar27 & 0x10) == 0) {
        pTVar15 = LLVMBC::Value::getType((Value *)pCVar11);
        pTVar15 = LLVMBC::Type::getStructElementType(pTVar15,0);
        Converter::Impl::decorate_relaxed_precision(impl,pTVar15,pOVar18->id,true);
      }
      buffer._0_8_ = component_ids;
      component_ids[1] = local_1048.index_id;
      component_ids[0] = image_id;
      buffer[8] = '\x02';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      Operation::add_ids(pOVar18,(initializer_list<unsigned_int> *)buffer);
      pmVar13 = local_10b8;
      Converter::Impl::add(impl,pOVar18,local_10b8->rov);
      if ((uVar27 & 0x10) != 0) {
        Converter::Impl::repack_sparse_feedback
                  (impl,pmVar13->component_type,4,(Value *)pCVar11,local_10a0,0);
        return true;
      }
      Converter::Impl::fixup_load_type_typed
                (impl,pmVar13->component_type,4,(Value *)pCVar11,local_10a0);
      build_exploded_composite_from_vector(impl,&pCVar11->super_Instruction,4);
      return true;
    }
    uVar22 = BVar17.raw_vec_size + V2;
    if (uVar23 == 0) {
      uVar21 = 0;
      local_1088 = 0;
      while (uVar26 = (uint)local_1088, uVar21 != 4) {
        uVar26 = uVar21 & 0x1f;
        uVar21 = uVar21 + 1;
        if ((local_1080->access_mask >> uVar26 & 1) != 0) {
          local_1088 = (ulong)uVar21;
        }
      }
    }
    else {
      local_1088 = 1;
      uVar26 = uVar22;
    }
    component_ids[0] = 0;
    component_ids[1] = 0;
    component_ids[2] = 0;
    component_ids[3] = 0;
    if (TVar6 == DoubleTyID) {
      IVar5 = spv::Builder::makeFloatType
                        (local_10a8,*(int *)(&DAT_001a586c + (long)(int)(width - B16) * 4));
    }
    else {
      IVar5 = spv::Builder::makeUintType
                        (local_10a8,*(int *)(&DAT_001a586c + (long)(int)(width - B16) * 4));
    }
    if (uVar23 != 0) {
      IVar5 = spv::Builder::makeVectorType(pBVar29,IVar5,uVar22);
    }
    SVar2 = local_10b8->storage;
    pTVar15 = LLVMBC::Type::getStructElementType(local_1098,0);
    TVar6 = LLVMBC::Type::getTypeID(pTVar15);
    cVar25 = '\x01';
    if (TVar6 == IntegerTyID) {
      bVar3 = type_is_16bit(pTVar15);
      if ((bVar3) && ((impl->execution_mode_meta).native_16bit_operations == false)) {
        cVar25 = (impl->options).min_precision_prefer_native_16bit;
      }
      else {
        cVar25 = '\0';
      }
    }
    uVar22 = (uVar27 & 0x10) >> 4;
    TVar6 = LLVMBC::Type::getTypeID(local_10a0);
    pBVar29 = local_10a8;
    if (TVar6 == DoubleTyID) {
      cVar25 = '\0';
    }
    local_103c = uVar22;
    if (((byte)uVar22 & SVar2 == StorageClassStorageBuffer) == 1) {
      p_Var14 = get_thread_log_callback();
      if (p_Var14 == (LoggingCallback)0x0) {
        __ptr = "[ERROR]: Cannot use SSBOs and sparse feedback. >:(\n";
        sStack_10e0 = 0x33;
        goto LAB_00165d87;
      }
      builtin_strncpy(buffer + 0x10," and sparse feedback. >:(\n",0x1b);
      uVar30._0_1_ = 's';
      uVar30._1_1_ = 'e';
      uVar30._2_1_ = ' ';
      uVar30._3_1_ = 'S';
      uVar31._0_1_ = 'S';
      uVar31._1_1_ = 'B';
      uVar31._2_1_ = 'O';
      uVar31._3_1_ = 's';
      goto LAB_0016572e;
    }
    if (SVar2 == StorageClassStorageBuffer) {
      IVar8 = spv::Builder::makePointer(local_10a8,StorageClassStorageBuffer,IVar5);
      pCVar11 = local_10b0;
      local_10a0 = (Type *)CONCAT44(local_10a0._4_4_,IVar8);
      for (uVar28 = 0; local_1088 != uVar28; uVar28 = uVar28 + 1) {
        if ((uVar23 == 0) && ((local_1080->access_mask >> ((uint)uVar28 & 0x1f) & 1) == 0)) {
          IVar8 = spv::Builder::createUndefined(pBVar29,IVar5);
        }
        else {
          pOVar18 = Converter::Impl::allocate(impl,OpAccessChain,(Id)local_10a0);
          Operation::add_id(pOVar18,image_id);
          IVar8 = spv::Builder::makeUintConstant(pBVar29,0,false);
          Operation::add_id(pOVar18,IVar8);
          IVar8 = Converter::Impl::build_offset(impl,local_1048.index_id,(uint)uVar28);
          Operation::add_id(pOVar18,IVar8);
          Converter::Impl::add(impl,pOVar18,false);
          if (local_10b8->non_uniform == true) {
            spv::Builder::addDecoration(pBVar29,pOVar18->id,DecorationNonUniform,-1);
          }
          pOVar20 = Converter::Impl::allocate(impl,OpLoad,IVar5);
          Operation::add_id(pOVar20,pOVar18->id);
          Converter::Impl::add(impl,pOVar20,local_10b8->rov);
          IVar8 = pOVar20->id;
          pBVar29 = local_10a8;
        }
        component_ids[uVar28] = IVar8;
      }
      if (uVar23 == 0) {
        IVar5 = Converter::Impl::build_vector(impl,IVar5,component_ids,uVar26);
      }
      else {
        IVar5 = component_ids[0];
      }
LAB_00165c11:
      if ((uVar27 & 0x10) != 0) goto LAB_00165d42;
    }
    else {
      pTVar16 = (Type *)(ulong)uVar26;
      bVar3 = spv::Builder::isStorageImageType(local_10a8,(Id)local_1090);
      IVar8 = spv::Builder::makeVectorType(pBVar29,IVar5,4);
      pCVar11 = local_10b0;
      uVar23 = (ulong)IVar8;
      uVar28 = 0;
      local_1060 = 0;
      if ((uVar27 & 0x10) != 0) {
        buffer[0] = '\0';
        buffer[1] = '\0';
        buffer[2] = '\0';
        buffer[3] = '\0';
        buffer[4] = '\0';
        buffer[5] = '\0';
        buffer[6] = '\0';
        buffer[7] = '\0';
        buffer[8] = '\0';
        buffer[9] = '\0';
        buffer[10] = '\0';
        buffer[0xb] = '\0';
        buffer[0xc] = '\0';
        buffer[0xd] = '\0';
        buffer[0xe] = '\0';
        buffer[0xf] = '\0';
        buffer[0x10] = '\0';
        buffer[0x11] = '\0';
        buffer[0x12] = '\0';
        buffer[0x13] = '\0';
        buffer[0x14] = '\0';
        buffer[0x15] = '\0';
        buffer[0x16] = '\0';
        buffer[0x17] = '\0';
        local_1050 = IVar5;
        local_104c = IVar8;
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_range_initialize<unsigned_int_const*>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)buffer,
                   &local_1050);
        local_1060 = Converter::Impl::get_struct_type
                               (impl,(Vector<spv::Id> *)buffer,0,"SparseTexel");
        std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
        ~_Vector_base((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                      buffer);
        uVar23 = extraout_RAX;
      }
      local_1088 = CONCAT44(local_1088._4_4_,(int)CONCAT71((int7)(uVar23 >> 8),1));
      local_1098 = pTVar16;
      for (pTVar24 = (Type *)0x0; pBVar29 = local_10a8, pTVar16 != pTVar24;
          pTVar24 = (Type *)((long)&pTVar24->context + 1)) {
        if ((local_1080->access_mask >> ((uint)pTVar24 & 0x1f) & 1) == 0) {
          IVar10 = spv::Builder::makeUintType(local_10a8,0x20);
          uVar22 = spv::Builder::createUndefined(pBVar29,IVar10);
        }
        else {
          bVar4 = (byte)local_1088 & (byte)local_103c;
          local_10a0 = (Type *)CONCAT71(local_10a0._1_7_,bVar4);
          OVar9 = OpImageRead;
          if (bVar4 != 0) {
            OVar9 = OpImageSparseRead;
          }
          OVar7 = OpImageFetch;
          IVar10 = IVar8;
          if (bVar4 != 0) {
            OVar7 = OpImageSparseFetch;
            IVar10 = local_1060;
          }
          if (bVar3) {
            OVar7 = OVar9;
          }
          local_1090 = uVar28;
          pOVar18 = Converter::Impl::allocate(impl,OVar7,IVar10);
          local_1050 = image_id;
          local_104c = Converter::Impl::build_offset(impl,local_1048.index_id,(uint)pTVar24);
          buffer._0_8_ = &local_1050;
          buffer[8] = '\x02';
          buffer[9] = '\0';
          buffer[10] = '\0';
          buffer[0xb] = '\0';
          buffer[0xc] = '\0';
          buffer[0xd] = '\0';
          buffer[0xe] = '\0';
          buffer[0xf] = '\0';
          Operation::add_ids(pOVar18,(initializer_list<unsigned_int> *)buffer);
          Converter::Impl::add(impl,pOVar18,local_10b8->rov);
          pOVar20 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar5);
          Operation::add_id(pOVar20,pOVar18->id);
          local_1088 = local_1088 & 0xffffffff00000000;
          Operation::add_literal(pOVar20,0);
          Converter::Impl::add(impl,pOVar20,false);
          uVar22 = pOVar20->id;
          uVar28 = (ulong)uVar22;
          if ((char)local_10a0 == '\x01') {
            pOVar20 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar5);
            Operation::add_id(pOVar20,pOVar18->id);
            Operation::add_literal(pOVar20,1);
            local_1088 = local_1088 & 0xffffffff00000000;
            Operation::add_literal(pOVar20,0);
            Converter::Impl::add(impl,pOVar20,false);
            uVar22 = pOVar20->id;
            pCVar11 = local_10b0;
            pTVar16 = local_1098;
          }
          else {
            uVar28 = local_1090 & 0xffffffff;
            pCVar11 = local_10b0;
            pTVar16 = local_1098;
          }
        }
        component_ids[(long)pTVar24] = uVar22;
      }
      if ((uVar27 & 0x10) != 0) {
        pOVar18 = Converter::Impl::allocate(impl,OpCompositeConstruct,(Value *)pCVar11);
        if (cVar25 != '\0') {
          for (pTVar16 = (Type *)0x0; local_1098 != pTVar16;
              pTVar16 = (Type *)((long)&pTVar16->context + 1)) {
            IVar5 = Converter::Impl::get_type_id(impl,pTVar15,0);
            pOVar20 = Converter::Impl::allocate(impl,OpBitcast,IVar5);
            Operation::add_id(pOVar20,component_ids[(long)pTVar16]);
            Converter::Impl::add(impl,pOVar20,false);
            component_ids[(long)pTVar16] = pOVar20->id;
          }
        }
        pTVar16 = local_1098;
        for (pTVar24 = (Type *)0x0; pCVar11 = local_10b0, uVar22 = uVar26, pTVar16 != pTVar24;
            pTVar24 = (Type *)((long)&pTVar24->context + 1)) {
          Operation::add_id(pOVar18,component_ids[(long)pTVar24]);
        }
        for (; local_1090 = uVar28, uVar22 < 4; uVar22 = uVar22 + 1) {
          IVar5 = Converter::Impl::get_type_id(impl,pTVar15,0);
          IVar5 = spv::Builder::createUndefined(local_10a8,IVar5);
          Operation::add_id(pOVar18,IVar5);
          uVar28 = local_1090;
        }
        Operation::add_id(pOVar18,(Id)local_1090);
        IVar5 = 0;
        Converter::Impl::add(impl,pOVar18,false);
        goto LAB_00165c11;
      }
      IVar5 = Converter::Impl::build_vector(impl,IVar5,component_ids,(uint)pTVar16);
    }
    if (cVar25 != '\0') {
      bVar3 = type_is_16bit(pTVar15);
      if (((bVar3) && ((impl->execution_mode_meta).native_16bit_operations == false)) &&
         ((impl->options).min_precision_prefer_native_16bit == true)) {
        TVar6 = LLVMBC::Type::getTypeID(pTVar15);
        if (TVar6 == HalfTyID) {
          IVar8 = Converter::Impl::get_type_id(impl,F32,1,uVar26,false);
          pOVar18 = Converter::Impl::allocate(impl,OpBitcast,IVar8);
          Operation::add_id(pOVar18,IVar5);
          Converter::Impl::add(impl,pOVar18,false);
          IVar5 = pOVar18->id;
          IVar8 = Converter::Impl::get_type_id(impl,F16,1,uVar26,false);
          OVar9 = OpFConvert;
        }
        else {
          IVar8 = Converter::Impl::get_type_id(impl,U16,1,uVar26,false);
          OVar9 = OpUConvert;
        }
      }
      else {
        IVar8 = Converter::Impl::get_type_id(impl,pTVar15,0);
        IVar8 = Converter::Impl::build_vector_type(impl,IVar8,uVar26);
        OVar9 = OpBitcast;
      }
      pOVar18 = Converter::Impl::allocate(impl,OVar9,IVar8);
      Operation::add_id(pOVar18,IVar5);
      Converter::Impl::add(impl,pOVar18,false);
      IVar5 = pOVar18->id;
    }
    Converter::Impl::rewrite_value(impl,(Value *)pCVar11,IVar5);
  }
  build_exploded_composite_from_vector(impl,&pCVar11->super_Instruction,uVar26);
LAB_00165d42:
  local_1080->forced_composite = false;
  return true;
}

Assistant:

bool emit_buffer_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (impl.ags.num_instructions == 1)
	{
		if (instruction->getOperand(2) == impl.ags.backdoor_instructions[0])
		{
			impl.ags.active_uav_ptr = impl.get_id_for_value(instruction->getOperand(1));
			impl.ags.active_uav_op = DXIL::Op::BufferLoad;
			impl.ags.active_read_backdoor = instruction;
			return true;
		}
	}

	// Elide dead loads.
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;

	// Leave no gaps in the access mask to aid vectorization.
	// For reads, we can safely read components we not strictly need to read.
	uint32_t smeared_access_mask;

	if (meta.storage != spv::StorageClassUniformConstant)
	{
		smeared_access_mask = access_meta.access_mask & 0xfu;
		smeared_access_mask |= smeared_access_mask >> 1u;
		smeared_access_mask |= smeared_access_mask >> 2u;
	}
	else
		smeared_access_mask = 1;

	if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
	{
		if (sparse)
		{
			LOGE("Cannot use BDA and sparse feedback. >:(\n");
			return false;
		}

		// We don't know more about alignment in SM 5.1 BufferStore.
		// We know the type must be 32-bit however ...
		// Might be possible to do some fancy analysis to deduce a better alignment.

		return emit_physical_buffer_load_instruction(impl, instruction, meta.physical_pointer_meta,
		                                             smeared_access_mask, 4);
	}

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

	bool raw_access_chain = buffer_access_is_raw_access_chain(impl, meta) && !sparse;
	if (raw_access_chain)
		return emit_buffer_load_raw_chain_instruction(impl, instruction, meta, access_meta);

	auto *result_type = instruction->getType();
	auto *target_type = result_type->getStructElementType(0);

	bool is_typed = meta.kind == DXIL::ResourceKind::TypedBuffer;
	auto access = build_buffer_access(impl, instruction, 0, meta.index_offset_id,
	                                  result_type->getStructElementType(0),
	                                  smeared_access_mask);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, target_type);
	RawType raw_type = target_type->getTypeID() == llvm::Type::TypeID::DoubleTyID ?
	                   RawType::Float : RawType::Integer;

	image_id = get_buffer_alias_handle(impl, meta, image_id, raw_type, width, access.raw_vec_size);
	bool vectorized_load = access.raw_vec_size != RawVecSize::V1;

	// Sparse information is stored in the 5th component.
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	if (!is_typed)
	{
		// Unroll up to 4 loads. Ideally, we'd probably use physical_storage_buffer here, but unfortunately we have no indication
		// how many components we need to load here, and the number of components we load is not necessarily constant,
		// so we cannot reliably encode this information in the SRV.
		// The best we can do is to infer it from stride if we can.
		//unsigned conservative_num_elements = std::min(access.num_components, std::min(4u, access_meta.components));
		unsigned conservative_num_elements = 0;
		unsigned vecsize = raw_vecsize_to_vecsize(access.raw_vec_size);

		if (vectorized_load)
			conservative_num_elements = vecsize;
		else
		{
			for (unsigned i = 0; i < 4; i++)
				if ((access_meta.access_mask & (1u << i)) != 0)
					conservative_num_elements = i + 1;
		}

		spv::Id component_ids[4] = {};

		spv::Id extracted_id_type = raw_type == RawType::Integer ?
		                            builder.makeUintType(raw_width_to_bits(width)) :
		                            builder.makeFloatType(raw_width_to_bits(width));

		if (vectorized_load)
			extracted_id_type = builder.makeVectorType(extracted_id_type, vecsize);

		spv::Id constructed_id = 0;
		bool ssbo = meta.storage == spv::StorageClassStorageBuffer;

		auto *element_type = result_type->getStructElementType(0);
		bool need_cast = (element_type->getTypeID() != llvm::Type::TypeID::IntegerTyID) ||
		                 (type_is_16bit(element_type) && !impl.execution_mode_meta.native_16bit_operations &&
		                  impl.options.min_precision_prefer_native_16bit);

		// FP64 is handled directly.
		if (target_type->getTypeID() == llvm::Type::TypeID::DoubleTyID)
			need_cast = false;

		if (ssbo && sparse)
		{
			LOGE("Cannot use SSBOs and sparse feedback. >:(\n");
			return false;
		}

		if (ssbo)
		{
			spv::Id ptr_type = builder.makePointer(spv::StorageClassStorageBuffer, extracted_id_type);
			for (unsigned i = 0; i < (vectorized_load ? 1 : conservative_num_elements); i++)
			{
				if (vectorized_load || (access_meta.access_mask & (1u << i)) != 0)
				{
					auto *chain_op = impl.allocate(spv::OpAccessChain, ptr_type);
					chain_op->add_id(image_id);
					chain_op->add_id(builder.makeUintConstant(0));
					chain_op->add_id(impl.build_offset(access.index_id, i));
					impl.add(chain_op);

					if (meta.non_uniform)
						builder.addDecoration(chain_op->id, spv::DecorationNonUniform);

					auto *load_op = impl.allocate(spv::OpLoad, extracted_id_type);
					load_op->add_id(chain_op->id);
					impl.add(load_op, meta.rov);
					component_ids[i] = load_op->id;
				}
				else
					component_ids[i] = builder.createUndefined(extracted_id_type);
			}

			if (vectorized_load)
				constructed_id = component_ids[0];
			else
				constructed_id = impl.build_vector(extracted_id_type, component_ids, conservative_num_elements);
		}
		else
		{
			bool is_uav = builder.isStorageImageType(image_type_id);

			spv::Id loaded_id_type = builder.makeVectorType(extracted_id_type, 4);
			spv::Id sparse_code_id = 0;
			spv::Id sparse_loaded_id_type = 0;
			if (sparse)
				sparse_loaded_id_type = impl.get_struct_type({ extracted_id_type, loaded_id_type }, 0, "SparseTexel");

			bool first_load = true;
			for (unsigned i = 0; i < conservative_num_elements; i++)
			{
				if (access_meta.access_mask & (1u << i))
				{
					// There is no sane way to combine sparse feedback code, since it's completely opaque to application.
					// We could hypothetically return a vector of status code and deal with it magically, but let's not go there ...
					spv::Op opcode;
					if (is_uav)
						opcode = (sparse && first_load) ? spv::OpImageSparseRead : spv::OpImageRead;
					else
						opcode = (sparse && first_load) ? spv::OpImageSparseFetch : spv::OpImageFetch;

					Operation *loaded_op =
					    impl.allocate(opcode, (sparse && first_load) ? sparse_loaded_id_type : loaded_id_type);
					loaded_op->add_ids({ image_id, impl.build_offset(access.index_id, i) });
					impl.add(loaded_op, meta.rov);

					if (sparse && first_load)
					{
						auto *code_extract_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						code_extract_op->add_id(loaded_op->id);
						code_extract_op->add_literal(0);
						impl.add(code_extract_op);
						sparse_code_id = code_extract_op->id;

						Operation *extracted_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						extracted_op->add_id(loaded_op->id);
						extracted_op->add_literal(1);
						extracted_op->add_literal(0);
						impl.add(extracted_op);
						component_ids[i] = extracted_op->id;
					}
					else
					{
						Operation *extracted_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						extracted_op->add_id(loaded_op->id);
						extracted_op->add_literal(0);
						impl.add(extracted_op);
						component_ids[i] = extracted_op->id;
					}
					first_load = false;
				}
				else
					component_ids[i] = builder.createUndefined(builder.makeUintType(32));
			}

			if (sparse)
			{
				Operation *op = impl.allocate(spv::OpCompositeConstruct, instruction);

				if (need_cast)
				{
					for (unsigned i = 0; i < conservative_num_elements; i++)
					{
						auto *bitcast_op =
						    impl.allocate(spv::OpBitcast, impl.get_type_id(element_type));
						bitcast_op->add_id(component_ids[i]);
						impl.add(bitcast_op);
						component_ids[i] = bitcast_op->id;
					}
				}

				for (unsigned i = 0; i < conservative_num_elements; i++)
					op->add_id(component_ids[i]);
				for (unsigned i = conservative_num_elements; i < 4; i++)
					op->add_id(builder.createUndefined(impl.get_type_id(element_type)));
				op->add_id(sparse_code_id);
				impl.add(op);
			}
			else
			{
				constructed_id = impl.build_vector(extracted_id_type, component_ids, conservative_num_elements);
			}
		}

		if (!sparse)
		{
			if (need_cast)
			{
				spv::Id casted_id;

				if (type_is_16bit(element_type) &&
				    !impl.execution_mode_meta.native_16bit_operations &&
				    impl.options.min_precision_prefer_native_16bit)
				{
					if (element_type->getTypeID() == llvm::Type::TypeID::HalfTyID)
					{
						Operation *bitcast_op = impl.allocate(
							spv::OpBitcast,
							impl.get_type_id(DXIL::ComponentType::F32, 1, conservative_num_elements));
						bitcast_op->add_id(constructed_id);
						impl.add(bitcast_op);
						casted_id = bitcast_op->id;

						Operation *narrow_op = impl.allocate(
							spv::OpFConvert,
							impl.get_type_id(DXIL::ComponentType::F16, 1, conservative_num_elements));
						narrow_op->add_id(casted_id);
						impl.add(narrow_op);
						casted_id = narrow_op->id;
					}
					else
					{
						Operation *narrow_op = impl.allocate(
							spv::OpUConvert,
							impl.get_type_id(DXIL::ComponentType::U16, 1, conservative_num_elements));
						narrow_op->add_id(constructed_id);
						impl.add(narrow_op);
						casted_id = narrow_op->id;
					}
				}
				else
				{
					Operation *op = impl.allocate(
						spv::OpBitcast, impl.build_vector_type(impl.get_type_id(element_type), conservative_num_elements));
					op->add_id(constructed_id);
					impl.add(op);
					casted_id = op->id;
				}

				impl.rewrite_value(instruction, casted_id);
			}
			else
				impl.rewrite_value(instruction, constructed_id);

			build_exploded_composite_from_vector(impl, instruction, conservative_num_elements);
		}

		access_meta.forced_composite = false;
	}
	else
	{
		bool is_uav = builder.isStorageImageType(image_type_id);

		auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
		spv::Id texel_type = impl.get_type_id(effective_component_type, 1, 4);
		spv::Id sample_type;

		if (sparse)
			sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
		else
			sample_type = texel_type;

		spv::Op opcode;
		if (is_uav)
			opcode = sparse ? spv::OpImageSparseRead : spv::OpImageRead;
		else
			opcode = sparse ? spv::OpImageSparseFetch : spv::OpImageFetch;

		Operation *op = impl.allocate(opcode, instruction, sample_type);

		if (!sparse)
			impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

		op->add_ids({ image_id, access.index_id });
		impl.add(op, meta.rov);

		if (sparse)
			impl.repack_sparse_feedback(meta.component_type, 4, instruction, target_type);
		else
		{
			impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
			build_exploded_composite_from_vector(impl, instruction, 4);
		}
	}

	return true;
}